

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O3

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::create_index(SparseArray<re2::NFA::Thread_*> *this,int i)

{
  int iVar1;
  IndexValue *pIVar2;
  bool bVar3;
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
  _Var4;
  
  bVar3 = has_index(this,i);
  if (bVar3) {
    __assert_fail("!has_index(i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/sparse_array.h"
                  ,0x16a,
                  "void re2::SparseArray<re2::NFA::Thread *>::create_index(int) [Value = re2::NFA::Thread *]"
                 );
  }
  pIVar2 = (this->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
           _M_head_impl;
  _Var4._M_head_impl.len_ = (Deleter)0;
  if (pIVar2 != (IndexValue *)0x0) {
    _Var4._M_head_impl.len_ =
         (this->dense_).ptr_._M_t.
         super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
         .
         super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
         .
         super__Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
         ._M_head_impl;
  }
  if (this->size_ < (int)_Var4._M_head_impl.len_) {
    (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl[i] = this->size_;
    iVar1 = this->size_;
    pIVar2[iVar1].index_ = i;
    this->size_ = iVar1 + 1;
    return;
  }
  __assert_fail("size_ < max_size()",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/sparse_array.h"
                ,0x16b,
                "void re2::SparseArray<re2::NFA::Thread *>::create_index(int) [Value = re2::NFA::Thread *]"
               );
}

Assistant:

void SparseArray<Value>::create_index(int i) {
  assert(!has_index(i));
  assert(size_ < max_size());
  sparse_[i] = size_;
  dense_[size_].index_ = i;
  size_++;
}